

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Module.cpp
# Opt level: O0

Module * __thiscall Module::print_abi_cxx11_(Module *this)

{
  bool bVar1;
  reference ppGVar2;
  reference ppFVar3;
  long in_RSI;
  string local_b0 [32];
  Function *local_90;
  Function *func;
  iterator __end1_1;
  iterator __begin1_1;
  list<Function_*,_std::allocator<Function_*>_> *__range1_1;
  string local_60 [32];
  GlobalVariable *local_40;
  GlobalVariable *global_val;
  iterator __end1;
  iterator __begin1;
  list<GlobalVariable_*,_std::allocator<GlobalVariable_*>_> *__range1;
  Module *this_local;
  string *module_ir;
  
  std::__cxx11::string::string((string *)this);
  __end1 = std::__cxx11::list<GlobalVariable_*,_std::allocator<GlobalVariable_*>_>::begin
                     ((list<GlobalVariable_*,_std::allocator<GlobalVariable_*>_> *)(in_RSI + 8));
  global_val = (GlobalVariable *)
               std::__cxx11::list<GlobalVariable_*,_std::allocator<GlobalVariable_*>_>::end
                         ((list<GlobalVariable_*,_std::allocator<GlobalVariable_*>_> *)(in_RSI + 8))
  ;
  while (bVar1 = std::operator!=(&__end1,(_Self *)&global_val), bVar1) {
    ppGVar2 = std::_List_iterator<GlobalVariable_*>::operator*(&__end1);
    local_40 = *ppGVar2;
    (**(local_40->super_User).super_Value._vptr_Value)(local_60);
    std::__cxx11::string::operator+=((string *)this,local_60);
    std::__cxx11::string::~string(local_60);
    std::__cxx11::string::operator+=((string *)this,"\n");
    std::_List_iterator<GlobalVariable_*>::operator++(&__end1);
  }
  __end1_1 = std::__cxx11::list<Function_*,_std::allocator<Function_*>_>::begin
                       ((list<Function_*,_std::allocator<Function_*>_> *)(in_RSI + 0x20));
  func = (Function *)
         std::__cxx11::list<Function_*,_std::allocator<Function_*>_>::end
                   ((list<Function_*,_std::allocator<Function_*>_> *)(in_RSI + 0x20));
  while (bVar1 = std::operator!=(&__end1_1,(_Self *)&func), bVar1) {
    ppFVar3 = std::_List_iterator<Function_*>::operator*(&__end1_1);
    local_90 = *ppFVar3;
    (**(local_90->super_Value)._vptr_Value)(local_b0);
    std::__cxx11::string::operator+=((string *)this,local_b0);
    std::__cxx11::string::~string(local_b0);
    std::__cxx11::string::operator+=((string *)this,"\n");
    std::_List_iterator<Function_*>::operator++(&__end1_1);
  }
  return this;
}

Assistant:

std::string Module::print()
{
    std::string module_ir;
    for ( auto global_val : this->global_list_)
    {
        module_ir += global_val->print();
        module_ir += "\n";
    }
    for ( auto func : this->function_list_)
    {
        module_ir += func->print();
        module_ir += "\n";
    }
    return module_ir;
}